

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

bool __thiscall
r_comp::Compiler::read_boolean
          (Compiler *this,Ptr *node,bool enforce,Class *p,uint16_t write_index,
          uint16_t *extent_index,bool write)

{
  byte bVar1;
  uint16_t *extent_index_00;
  uint16_t write_index_00;
  bool bVar2;
  State SVar3;
  element_type *peVar4;
  Atom *this_00;
  shared_ptr<r_comp::RepliStruct> local_140;
  string local_130 [36];
  State local_10c;
  shared_ptr<r_comp::RepliStruct> local_108;
  State local_f8;
  Atom local_f4 [4];
  State s;
  shared_ptr<r_comp::RepliStruct> local_e0;
  shared_ptr<r_comp::RepliStruct> local_d0;
  Class local_c0;
  shared_ptr<r_comp::RepliStruct> local_78 [2];
  shared_ptr<r_comp::RepliStruct> local_58;
  byte local_41;
  uint16_t *puStack_40;
  bool write_local;
  uint16_t *extent_index_local;
  Class *pCStack_30;
  uint16_t write_index_local;
  Class *p_local;
  Ptr *pPStack_20;
  bool enforce_local;
  Ptr *node_local;
  Compiler *this_local;
  
  local_41 = write;
  puStack_40 = extent_index;
  extent_index_local._6_2_ = write_index;
  pCStack_30 = p;
  p_local._7_1_ = enforce;
  pPStack_20 = node;
  node_local = (Ptr *)this;
  std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_58,node);
  bVar2 = read_nil_bl(this,&local_58,extent_index_local._6_2_,puStack_40,(bool)(local_41 & 1));
  std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_58);
  if (!bVar2) {
    std::shared_ptr<r_comp::RepliStruct>::shared_ptr(local_78,node);
    write_index_00 = extent_index_local._6_2_;
    extent_index_00 = puStack_40;
    bVar1 = local_41;
    Class::Class(&local_c0,BOOLEAN);
    bVar2 = read_variable(this,local_78,write_index_00,extent_index_00,(bool)(bVar1 & 1),&local_c0);
    Class::~Class(&local_c0);
    std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(local_78);
    if (!bVar2) {
      std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_d0,node);
      bVar2 = read_reference(this,&local_d0,extent_index_local._6_2_,puStack_40,(bool)(local_41 & 1)
                             ,BOOLEAN);
      std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_d0);
      if (!bVar2) {
        std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_e0,node);
        bVar2 = read_wildcard(this,&local_e0,extent_index_local._6_2_,puStack_40,
                              (bool)(local_41 & 1));
        std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_e0);
        if (!bVar2) {
          std::shared_ptr<r_comp::RepliStruct>::shared_ptr
                    ((shared_ptr<r_comp::RepliStruct> *)&s,node);
          bVar2 = read_tail_wildcard(this,(Ptr *)&s,extent_index_local._6_2_,puStack_40,
                                     (bool)(local_41 & 1));
          std::shared_ptr<r_comp::RepliStruct>::~shared_ptr((shared_ptr<r_comp::RepliStruct> *)&s);
          if (!bVar2) {
            peVar4 = std::
                     __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)node);
            bVar2 = std::operator==(&peVar4->cmd,"true");
            if (!bVar2) {
              peVar4 = std::
                       __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)node);
              bVar2 = std::operator==(&peVar4->cmd,"false");
              if (!bVar2) {
                SVar3 = save_state(this);
                local_f8._0_3_ = SVar3._0_3_;
                std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_108,node);
                bVar2 = expression(this,&local_108,BOOLEAN,extent_index_local._6_2_,puStack_40,
                                   (bool)(local_41 & 1));
                std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_108);
                if (bVar2) {
                  return true;
                }
                local_10c = local_f8;
                restore_state(this,local_f8);
                if ((p_local._7_1_ & 1) == 0) {
                  return false;
                }
                std::
                __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)node);
                std::operator+((char *)local_130,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               " error: expected a Boolean or an expr evaluating to a Boolean, got: "
                              );
                std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_140,node);
                set_error(this,local_130,&local_140);
                std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_140);
                std::__cxx11::string::~string((string *)local_130);
                return false;
              }
            }
            if ((local_41 & 1) != 0) {
              peVar4 = std::
                       __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)node);
              std::operator==(&peVar4->cmd,"true");
              r_code::Atom::Boolean(SUB81(local_f4,0));
              this_00 = r_code::vector<r_code::Atom>::operator[]
                                  ((vector<r_code::Atom> *)(this->current_object + 8),
                                   (ulong)extent_index_local._6_2_);
              r_code::Atom::operator=(this_00,local_f4);
              r_code::Atom::~Atom(local_f4);
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool Compiler::read_boolean(RepliStruct::Ptr node, bool enforce, const Class *p, uint16_t write_index, uint16_t &extent_index, bool write)   // p always NULL
{
    if (read_nil_bl(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_variable(node, write_index, extent_index, write, BOOLEAN)) {
        return true;
    }

    if (read_reference(node, write_index, extent_index, write, BOOLEAN)) {
        return true;
    }

    if (read_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_tail_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (node->cmd == "true" || node->cmd == "false") {
        if (write) {
            current_object->code[write_index] = Atom::Boolean((node->cmd == "true"));
        }

        return true;
    }

    State s = save_state();

    if (expression(node, BOOLEAN, write_index, extent_index, write)) {
        return true;
    }

    restore_state(s);

    if (enforce) {
        set_error(" error: expected a Boolean or an expr evaluating to a Boolean, got: " + node->cmd, node);
        return false;
    }

    return false;
}